

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_file_dtype_parse(char *buffer,char *dtype,void *data,char *fmt)

{
  int iVar1;
  undefined1 local_c8 [8];
  char converted [128];
  variant_t p;
  char ndtype2 [8];
  char ndtype [8];
  char *fmt_local;
  void *data_local;
  char *dtype_local;
  char *buffer_local;
  
  _dtype_normalize((char *)&p,dtype);
  p._0_1_ = 0x3d;
  _dtype_normalize(ndtype2,(char *)&p);
  converted._120_8_ = local_c8;
  iVar1 = strcmp(ndtype2 + 1,"a1");
  ndtype = (char  [8])fmt;
  if (iVar1 == 0) {
    if (fmt == (char *)0x0) {
      ndtype = (char  [8])anon_var_dwarf_22ad;
    }
    __isoc99_sscanf(buffer,ndtype,converted._120_8_);
  }
  else {
    iVar1 = strcmp(ndtype2 + 1,"i8");
    if (iVar1 == 0) {
      if (fmt == (char *)0x0) {
        ndtype = (char  [8])anon_var_dwarf_22ce;
      }
      __isoc99_sscanf(buffer,ndtype,converted._120_8_);
    }
    else {
      iVar1 = strcmp(ndtype2 + 1,"i4");
      if (iVar1 == 0) {
        if (fmt == (char *)0x0) {
          ndtype = (char  [8])((long)" NMEMB: %d" + 8);
        }
        __isoc99_sscanf(buffer,ndtype,converted._120_8_);
      }
      else {
        iVar1 = strcmp(ndtype2 + 1,"u8");
        if (iVar1 == 0) {
          if (fmt == (char *)0x0) {
            ndtype = (char  [8])anon_var_dwarf_22fb;
          }
          __isoc99_sscanf(buffer,ndtype,converted._120_8_);
        }
        else {
          iVar1 = strcmp(ndtype2 + 1,"u4");
          if (iVar1 == 0) {
            if (fmt == (char *)0x0) {
              ndtype = (char  [8])((long)" %06X: %td : %u : %u" + 0x12);
            }
            __isoc99_sscanf(buffer,ndtype,converted._120_8_);
          }
          else {
            iVar1 = strcmp(ndtype2 + 1,"f8");
            if (iVar1 == 0) {
              if (fmt == (char *)0x0) {
                ndtype = (char  [8])anon_var_dwarf_2375;
              }
              __isoc99_sscanf(buffer,ndtype,converted._120_8_);
            }
            else {
              iVar1 = strcmp(ndtype2 + 1,"f4");
              if (iVar1 == 0) {
                if (fmt == (char *)0x0) {
                  ndtype = (char  [8])anon_var_dwarf_2380;
                }
                __isoc99_sscanf(buffer,ndtype,converted._120_8_);
              }
              else {
                iVar1 = strcmp(ndtype2 + 1,"c8");
                if (iVar1 == 0) {
                  if (fmt == (char *)0x0) {
                    ndtype = (char  [8])anon_var_dwarf_238b;
                  }
                  __isoc99_sscanf(buffer,ndtype,converted._120_8_,converted._120_8_ + 4);
                }
                else {
                  iVar1 = strcmp(ndtype2 + 1,"c16");
                  if (iVar1 != 0) {
                    return -1;
                  }
                  if (fmt == (char *)0x0) {
                    ndtype = (char  [8])anon_var_dwarf_2396;
                  }
                  __isoc99_sscanf(buffer,ndtype,converted._120_8_,converted._120_8_ + 8);
                }
              }
            }
          }
        }
      }
    }
  }
  dtype_convert_simple(data,dtype,local_c8,ndtype2,1);
  return 0;
}

Assistant:

int
big_file_dtype_parse(const char * buffer, const char * dtype, void * data, const char * fmt)
{
    char ndtype[8];
    char ndtype2[8];
    variant_t p;

    /* handle the endianness stuff in case it is not machine */
    char converted[128];

    _dtype_normalize(ndtype2, dtype);
    ndtype2[0] = '=';
    _dtype_normalize(ndtype, ndtype2);

    p.v = converted;
#define PARSE1(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sscanf(buffer, fmt, p.dtype); \
    }
#define PARSE2(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sscanf(buffer, fmt, &p.dtype->r, &p.dtype->i); \
    }
    PARSE1(a1, "%c") else
    PARSE1(i8, "%ld") else
    PARSE1(i4, "%d") else
    PARSE1(u8, "%lu") else
    PARSE1(u4, "%u") else
    PARSE1(f8, "%lf") else
    PARSE1(f4, "%f") else
    PARSE2(c8, "%f + %f I") else
    PARSE2(c16, "%lf + %lf I") else
    return -1;

    dtype_convert_simple(data, dtype, converted, ndtype, 1);

    return 0;
}